

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcmain3.c
# Opt level: O0

LispPTR gcscanstack(void)

{
  ushort uVar1;
  Bframe BVar2;
  Bframe *pBVar3;
  Bframe *pBVar4;
  DLword *pDVar5;
  LispPTR *pLVar6;
  DLword *pDVar7;
  char local_308 [4];
  LispPTR bf_word;
  char debugStr_5 [100];
  char local_298 [8];
  char debugStr_4 [100];
  char local_228 [8];
  char debugStr_3 [100];
  char local_1b8 [8];
  char debugStr_2 [100];
  char local_148 [4];
  LispPTR value_1;
  char debugStr_1 [100];
  Bframe *pBStack_d8;
  LispPTR nametable;
  UNSIGNED ntend;
  UNSIGNED next;
  UNSIGNED qtemp;
  Bframe *pBStack_b8;
  LispPTR value;
  LispPTR *pvars;
  int pcou;
  LispPTR fn_head;
  fnhead *fnheader;
  frameex1 *frameex;
  char debugStr [100];
  int ftyp;
  UNSIGNED scanend68K;
  LispPTR scanend;
  LispPTR scanptr;
  Bframe *obasicframe;
  Bframe *basicframe;
  
  uVar1 = InterfacePage->stackbase;
  pBVar4 = (Bframe *)NativeAligned2FromLAddr(InterfacePage->endofstack | 0x10000);
  pDVar5 = (DLword *)NativeAligned4FromLAddr(uVar1 | 0x10000);
  if (((ulong)pDVar5 & 3) != 0) {
    sprintf((char *)&frameex,"Frame ptr (%p) not to word bound at start of gcscanstack.",pDVar5);
    error((char *)&frameex);
  }
  while( true ) {
    while( true ) {
      while( true ) {
        while (obasicframe = (Bframe *)pDVar5, uVar1 = *(ushort *)&obasicframe->field_0x2 >> 0xd,
              uVar1 == 5) {
          pDVar5 = &obasicframe->ivar + (int)(uint)obasicframe->ivar;
          if (((ulong)pDVar5 & 3) != 0) {
            sprintf(local_308,
                    "Frame ptr (%p) not to word bound in gcscanstack() STK_FSB; old frame = %p.",
                    pDVar5,obasicframe);
            error(local_308);
          }
        }
        if (uVar1 != 6) break;
        BVar2 = obasicframe[1];
        if (((*(ushort *)((ulong)(MDStypetbl + ((uint)BVar2 >> 9)) ^ 2) & 0x8000) == 0) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind((LispPTR)BVar2,2);
        }
        pLVar6 = NativeAligned4FromLAddr((LispPTR)BVar2);
        pBStack_b8 = obasicframe + 5;
        pvars._0_4_ = (uint)(ushort)((ushort)pLVar6[3] >> 8);
        while ((uint)pvars != 0) {
          BVar2 = *pBStack_b8;
          if ((((uint)BVar2 >> 0x1c == 0) &&
              ((*(ushort *)((ulong)(MDStypetbl + ((uint)BVar2 >> 9)) ^ 2) & 0x8000) == 0)) &&
             (*GcDisabled_word != 0x4c)) {
            rec_htfind((LispPTR)BVar2,2);
          }
          pBStack_b8 = pBStack_b8 + 1;
          pvars._0_4_ = (uint)pvars - 1;
        }
        pDVar5 = NativeAligned2FromStackOffset(*(DLword *)&obasicframe[2].field_0x2);
        pBStack_d8 = (Bframe *)0x0;
        next = (UNSIGNED)pDVar5;
        if ((*(ushort *)&obasicframe->field_0x2 >> 9 & 1) != 0) {
          BVar2 = obasicframe[3];
          if ((uint)BVar2 >> 0x10 == 1) {
            if (((*(ushort *)((ulong)(MDStypetbl + ((int)(pLVar6[2] & 0xfffffff) >> 9)) ^ 2) &
                 0x8000) == 0) && (*GcDisabled_word != 0x4c)) {
              rec_htfind(pLVar6[2] & 0xfffffff,2);
            }
            next = (UNSIGNED)NativeAligned2FromStackOffset(BVar2.ivar);
            pBStack_d8 = (Bframe *)
                         (next + ((long)(int)((uint)*(ushort *)(next + 0xe) << 1) + 8) * 2);
          }
          else if (((*(ushort *)((ulong)(MDStypetbl + ((uint)BVar2 >> 9)) ^ 2) & 0x8000) == 0) &&
                  (*GcDisabled_word != 0x4c)) {
            rec_htfind((LispPTR)BVar2,2);
          }
        }
        pDVar7 = &obasicframe->ivar + ((*(short *)((long)pLVar6 + 6) + 1) * 4 + 0xe);
        if (((ulong)pDVar7 & 3) != 0) {
          sprintf(local_148,
                  "Frame ptr (%p) not to word bound in gcscanstack() STK_FX case; old frame = %p.",
                  pDVar7,obasicframe);
          error(local_148);
        }
        while( true ) {
          while (obasicframe = (Bframe *)pDVar7, pBVar3 = obasicframe, obasicframe < next) {
            BVar2 = *obasicframe;
            if ((((uint)BVar2 >> 0x1c == 0) &&
                ((*(ushort *)((ulong)(MDStypetbl + ((uint)BVar2 >> 9)) ^ 2) & 0x8000) == 0)) &&
               (*GcDisabled_word != 0x4c)) {
              rec_htfind((LispPTR)BVar2,2);
            }
            pDVar7 = &obasicframe[1].ivar;
          }
          if (pBStack_d8 == (Bframe *)0x0) break;
          obasicframe = pBStack_d8;
          if (((ulong)pBStack_d8 & 3) != 0) {
            sprintf(local_1b8,
                    "Frame ptr (%p) not to word bound in gcscanstack() scantemps; old frame = %p.",
                    pBStack_d8,pBVar3);
            error(local_1b8);
          }
          pBStack_d8 = (Bframe *)0x0;
          pDVar7 = &obasicframe->ivar;
          next = (UNSIGNED)pDVar5;
        }
        if (((ulong)pDVar5 & 3) != 0) {
          sprintf(local_228,
                  "Frame ptr (%p) not to word bound in gcscanstack(), end scantemps; old frame = %p."
                  ,pDVar5,obasicframe);
          error(local_228);
        }
      }
      if (uVar1 == 7) break;
      for (; BVar2 = *obasicframe, (uint)BVar2 >> 0x1d != 4; obasicframe = obasicframe + 1) {
        if (((*(ushort *)((ulong)(MDStypetbl + (((uint)BVar2 & 0xfffffff) >> 9)) ^ 2) & 0x8000) == 0
            ) && (*GcDisabled_word != 0x4c)) {
          rec_htfind((uint)BVar2 & 0xfffffff,2);
        }
      }
      pDVar5 = &obasicframe[1].ivar;
    }
    if (pBVar4 <= obasicframe) break;
    pDVar5 = &obasicframe->ivar + (int)(uint)obasicframe->ivar;
    if (((ulong)pDVar5 & 3) != 0) {
      sprintf(local_298,
              "Frame ptr (%p) not to word bound in gcscanstack() STK_GUARD; old frame = %p.",pDVar5,
              obasicframe);
      error(local_298);
    }
  }
  return 0;
}

Assistant:

LispPTR gcscanstack(void) {
  Bframe *basicframe;
  Bframe *obasicframe;
  LispPTR scanptr, scanend;
  UNSIGNED scanend68K;
  int ftyp;

  scanptr = VAG2(STK_HI, InterfacePage->stackbase);
  scanend = VAG2(STK_HI, InterfacePage->endofstack);
  scanend68K = (UNSIGNED)NativeAligned2FromLAddr(scanend);
  basicframe = (Bframe *)NativeAligned4FromLAddr(scanptr);

  if (0 != (3 & (UNSIGNED)basicframe)) {
    char debugStr[100];
    sprintf(debugStr,
            "Frame ptr (%p) not to word bound at start of gcscanstack.",
            (void *)basicframe);
    error(debugStr);
  }

  while (1) {
    /*This is endless loop until encountering tail of stack */

    ftyp = (int)basicframe->flags;
    switch (ftyp) {
      case STK_FX: {
        {
          struct frameex1 *frameex;
          struct fnhead *fnheader;
          frameex = (struct frameex1 *)basicframe;
          {
            LispPTR fn_head;
#ifdef BIGVM
            fn_head = (LispPTR)(frameex->fnheader);
#else
            fn_head = (LispPTR)VAG2(frameex->hi2fnheader, frameex->lofnheader);
#endif /* BIGVM */
            Stkref(fn_head);
            fnheader = (struct fnhead *)NativeAligned4FromLAddr(fn_head);
          }
          {
            int pcou;
            LispPTR *pvars;
            pvars = (LispPTR *)((DLword *)basicframe + FRAMESIZE);
            for (pcou = fnheader->nlocals; pcou-- != 0;) {
              LispPTR value;
              value = *pvars;
              if
                Boundp(BIND_BITS(value)) Stkref(value);
              ++pvars;
            } /* for */
          }   /* int pcou */

          {
            UNSIGNED qtemp;
            UNSIGNED next;
            UNSIGNED ntend;

            next = qtemp = (UNSIGNED)NativeAligned2FromStackOffset(frameex->nextblock);
            /* this is offset */
            ntend = 0; /* init flag */
            if (frameex->validnametable) {
              LispPTR nametable;
#ifdef BIGVM
              nametable = frameex->nametable;
#define hi2nametable (nametable >> 16)
#else
              unsigned int hi2nametable;
              unsigned int lonametable;
              lonametable = frameex->lonametable;
              hi2nametable = frameex->hi2nametable;
              nametable = VAG2(hi2nametable, lonametable);
#endif /* BIGVM */
              if (STK_HI == hi2nametable) {
                Stkref(fnheader->framename);
#ifdef BIGVM
                qtemp = (UNSIGNED)NativeAligned2FromStackOffset(nametable & 0xFFFF);
#else
                qtemp = (UNSIGNED)NativeAligned2FromStackOffset(lonametable);
#endif
                ntend = (UNSIGNED)(((DLword *)qtemp) + FNHEADSIZE +
                                   (((struct fnhead *)qtemp)->ntsize) * 2);
              } else
                Stkref(nametable);
            } /* frameex->validnametable */

            obasicframe = basicframe;
            basicframe =
                (Bframe *)ADD_OFFSET(basicframe, FRAMESIZE + PADDING + (((fnheader->pv) + 1) << 2));

            if (0 != (3 & (UNSIGNED)basicframe)) {
              char debugStr[100];
              sprintf(debugStr,
                      "Frame ptr (%p) not to word bound "
                      "in gcscanstack() STK_FX case; old frame = %p.",
                      (void *)basicframe, (void *)obasicframe);
              error(debugStr);
            }

          scantemps:
            while ((UNSIGNED)basicframe < (UNSIGNED)qtemp) {
              LispPTR value;
              value = *((LispPTR *)basicframe);
              if
                Boundp(BIND_BITS(value)) Stkref(value);
              basicframe++;
            } /* while */

            if (ntend != 0) {
              obasicframe = basicframe;
              basicframe = (Bframe *)ntend;
              if (0 != (3 & (UNSIGNED)basicframe)) {
                char debugStr[100];
                sprintf(debugStr,
                        "Frame ptr (%p) not to word bound "
                        "in gcscanstack() scantemps; old frame = %p.",
                        (void *)basicframe, (void *)obasicframe);
                error(debugStr);
              }

              qtemp = next;
              ntend = 0;
              goto scantemps;
            }

            obasicframe = basicframe;
            basicframe = (Bframe *)next;

            if (0 != (3 & (UNSIGNED)basicframe)) {
              char debugStr[100];
              sprintf(debugStr,
                      "Frame ptr (%p) not to word bound "
                      "in gcscanstack(), end scantemps; old frame = %p.",
                      (void *)basicframe, (void *)obasicframe);
              error(debugStr);
            }

          } /* LOCAL regs qtemp next */
        }   /* local regs fnheader frameex */
        break;
      }
      case STK_GUARD: /* stack's tail ? */ {
        if ((UNSIGNED)basicframe >= (UNSIGNED)scanend68K)
          return (NIL);
        else {
          obasicframe = basicframe;
          basicframe = (Bframe *)((DLword *)basicframe + basicframe->ivar);

          if (0 != (3 & (UNSIGNED)basicframe)) {
            char debugStr[100];
            sprintf(debugStr,
                    "Frame ptr (%p) not to word bound "
                    "in gcscanstack() STK_GUARD; old frame = %p.",
                    (void *)basicframe, (void *)obasicframe);
            error(debugStr);
          }
        }
        break;
      }
      case STK_FSB: {
        obasicframe = basicframe;
        basicframe = (Bframe *)((DLword *)basicframe + basicframe->ivar);

        if (0 != (3 & (UNSIGNED)basicframe)) {
          char debugStr[100];
          sprintf(debugStr,
                  "Frame ptr (%p) not to word bound "
                  "in gcscanstack() STK_FSB; old frame = %p.",
                  (void *)basicframe, (void *)obasicframe);
          error(debugStr);
        }

        break;
      }
      default: /* must be basic frame !! */
      {
        LispPTR bf_word;
        while (STK_BF != BF_FLAGS(bf_word = *((LispPTR *)basicframe))) {
          Stkref(PTR_BITS(bf_word));
          basicframe++;
        }
        basicframe++;
      }

        /* **** NOTE THIS CODE DOES NOT COMPILE CORRECTLY ON THE SUN 4
           {LispPTR bf_word;
           while(STK_BF != BF_FLAGS(
           bf_word = *((LispPTR *)basicframe++)))
           { Stkref(PTR_BITS(bf_word));
           }
           }
           **** */
    } /* switch */
  }   /* while(1) */
}